

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgPrettyPrinter.cpp
# Opt level: O2

void __thiscall rsg::PrettyPrinter::processToken(PrettyPrinter *this,Token *token)

{
  Type TVar1;
  size_type sVar2;
  ostream *poVar3;
  bool bVar4;
  long lVar5;
  int i;
  int iVar6;
  float local_44;
  string f;
  
  sVar2 = (this->m_line)._M_string_length;
  if (sVar2 == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = isIdentifierChar((this->m_line)._M_dataplus._M_p[sVar2 - 1]);
  }
  TVar1 = token->m_type;
  if ((ulong)TVar1 != 0) {
    if (TVar1 == FLOAT_LITERAL) {
      local_44 = (token->m_arg).floatValue;
      de::toString<float>(&f,&local_44);
      lVar5 = std::__cxx11::string::find((char)&f,0x2e);
      if (lVar5 == -1) {
        std::__cxx11::string::append((char *)&f);
      }
      std::__cxx11::string::append((string *)this);
    }
    else {
      if (TVar1 != INT_LITERAL) {
        if (TVar1 != BOOL_LITERAL) {
          if (TVar1 == INDENT_INC) {
            this->m_indentDepth = this->m_indentDepth + 1;
            return;
          }
          if (TVar1 == INDENT_DEC) {
            this->m_indentDepth = this->m_indentDepth + -1;
            return;
          }
          if (TVar1 == NEWLINE) {
            for (iVar6 = 0; poVar3 = (ostream *)this->m_str, iVar6 < this->m_indentDepth;
                iVar6 = iVar6 + 1) {
              std::operator<<(poVar3,"\t");
            }
            std::operator+(&f,&this->m_line,"\n");
            std::operator<<(poVar3,(string *)&f);
            std::__cxx11::string::~string((string *)&f);
            std::__cxx11::string::assign((char *)this);
            return;
          }
          if ((bVar4 != false) &&
             (bVar4 = isIdentifierChar(**(char **)(s_tokenStr + (ulong)TVar1 * 8)), bVar4)) {
            std::__cxx11::string::append((char *)this);
          }
        }
        goto LAB_0054bb09;
      }
      local_44 = (token->m_arg).floatValue;
      de::toString<int>(&f,(int *)&local_44);
      std::__cxx11::string::append((string *)this);
    }
    std::__cxx11::string::~string((string *)&f);
    return;
  }
  if (bVar4 != false) {
    std::__cxx11::string::append((char *)this);
  }
LAB_0054bb09:
  std::__cxx11::string::append((char *)this);
  return;
}

Assistant:

void PrettyPrinter::processToken (const Token& token)
{
	bool prevIsIdentifierChar = m_line.length() > 0 && isIdentifierChar(m_line[m_line.length()-1]);

	switch (token.getType())
	{
		case Token::IDENTIFIER:
			if (prevIsIdentifierChar)
				m_line += " ";
			m_line += token.getIdentifier();
			break;

		case Token::FLOAT_LITERAL:
		{
			std::string f = de::toString(token.getFloat());
			if (f.find('.') == std::string::npos)
				f += ".0"; // Make sure value parses as float
			m_line += f;
			break;
		}

		case Token::INT_LITERAL:
			m_line += de::toString(token.getInt());
			break;

		case Token::BOOL_LITERAL:
			m_line += (token.getBool() ? "true" : "false");
			break;

		case Token::INDENT_INC:
			m_indentDepth += 1;
			break;

		case Token::INDENT_DEC:
			m_indentDepth -= 1;
			break;

		case Token::NEWLINE:
			// Indent
			for (int i = 0; i < m_indentDepth; i++)
				m_str << "\t";

			// Flush line to source
			m_str << m_line + "\n";
			m_line = "";
			break;

		default:
		{
			const char* tokenStr = getSimpleTokenStr(token.getType());
			if (prevIsIdentifierChar && isIdentifierChar(tokenStr[0]))
				m_line += " ";
			m_line += tokenStr;
			break;
		}
	}
}